

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

istream * operator>>(istream *is,Graph<Node> *g)

{
  Graph<Node> *this;
  istream *piVar1;
  Edge local_38;
  int local_2c;
  int local_28;
  int cost;
  int y;
  int x;
  int i;
  int inputEdgeCnt;
  Graph<Node> *g_local;
  istream *is_local;
  
  _i = g;
  g_local = (Graph<Node> *)is;
  piVar1 = (istream *)std::istream::operator>>((istream *)is,&g->_nodeCnt);
  std::istream::operator>>(piVar1,&x);
  Graph<Node>::resize(_i,_i->_nodeCnt);
  for (y = 0; y < x; y = y + 1) {
    piVar1 = (istream *)std::istream::operator>>((istream *)g_local,&cost);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&local_28);
    std::istream::operator>>(piVar1,&local_2c);
    this = _i;
    Edge::Edge(&local_38,cost,local_28,local_2c);
    Graph<Node>::addEdge(this,&local_38);
    Edge::~Edge(&local_38);
  }
  return (istream *)g_local;
}

Assistant:

std::istream &operator >> (std::istream &is, Graph <NodeT> &g) {
        int inputEdgeCnt;
        is >> g._nodeCnt >> inputEdgeCnt;
        g.resize(g._nodeCnt);
        for (int i = 0; i < inputEdgeCnt; ++i) {
            int x, y, cost;
            is >> x >> y >> cost;
            g.addEdge(Edge(x, y, cost));
        }
        return is;
    }